

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPParser.cpp
# Opt level: O0

SNMP_PERMISSION
getPermissionOfRequest(SNMPPacket *request,string *_community,string *_readOnlyCommunity)

{
  __type _Var1;
  ulong uVar2;
  SNMP_PERMISSION local_24;
  SNMP_PERMISSION requestPermission;
  string *_readOnlyCommunity_local;
  string *_community_local;
  SNMPPacket *request_local;
  
  local_24 = SNMP_PERM_NONE;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (_Var1 = std::operator==(_readOnlyCommunity,&request->communityString), _Var1)) {
    local_24 = SNMP_PERM_READ_ONLY;
  }
  _Var1 = std::operator==(_community,&request->communityString);
  if (_Var1) {
    local_24 = SNMP_PERM_READ_WRITE;
  }
  return local_24;
}

Assistant:

static SNMP_PERMISSION getPermissionOfRequest(const SNMPPacket& request, const std::string& _community, const std::string& _readOnlyCommunity){
    SNMP_PERMISSION requestPermission = SNMP_PERM_NONE;
    SNMP_LOGD("community string in packet: %s\n", request.communityString.c_str());

    if(!_readOnlyCommunity.empty() && _readOnlyCommunity == request.communityString) { // snmprequest->version != 1
        requestPermission = SNMP_PERM_READ_ONLY;
    }

    if(_community == request.communityString) { // snmprequest->version != 1
        requestPermission = SNMP_PERM_READ_WRITE;
    }
    return requestPermission;
}